

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# URDFModelExport.cpp
# Opt level: O3

bool iDynTree::exportXMLBlob(string *xmlBlob,xmlNodePtr parent_element)

{
  byte *pbVar1;
  byte bVar2;
  ulong uVar3;
  char *__s;
  int iVar4;
  size_t sVar5;
  long lVar6;
  byte *pbVar7;
  byte *pbVar8;
  byte *pbVar9;
  xmlNodePtr new_node;
  long local_38;
  
  local_38 = 0;
  pbVar8 = (byte *)(xmlBlob->_M_dataplus)._M_p;
  uVar3 = xmlBlob->_M_string_length;
  pbVar1 = pbVar8 + uVar3;
  pbVar7 = pbVar8;
  if (0 < (long)uVar3 >> 2) {
    pbVar7 = pbVar8 + (uVar3 & 0xfffffffffffffffc);
    lVar6 = ((long)uVar3 >> 2) + 1;
    pbVar9 = pbVar8 + 3;
    do {
      iVar4 = isprint((uint)pbVar9[-3]);
      if (iVar4 == 0) {
        pbVar9 = pbVar9 + -3;
        goto LAB_00127ff2;
      }
      iVar4 = isprint((uint)pbVar9[-2]);
      if (iVar4 == 0) {
        pbVar9 = pbVar9 + -2;
        goto LAB_00127ff2;
      }
      iVar4 = isprint((uint)pbVar9[-1]);
      if (iVar4 == 0) {
        pbVar9 = pbVar9 + -1;
        goto LAB_00127ff2;
      }
      iVar4 = isprint((uint)*pbVar9);
      if (iVar4 == 0) goto LAB_00127ff2;
      lVar6 = lVar6 + -1;
      pbVar9 = pbVar9 + 4;
    } while (1 < lVar6);
  }
  lVar6 = (long)pbVar1 - (long)pbVar7;
  if (lVar6 == 1) {
LAB_00127fcf:
    iVar4 = isprint((uint)*pbVar7);
    pbVar9 = pbVar7;
    if (iVar4 != 0) {
      pbVar9 = pbVar1;
    }
  }
  else if (lVar6 == 2) {
LAB_00127fbf:
    iVar4 = isprint((uint)*pbVar7);
    pbVar9 = pbVar7;
    if (iVar4 != 0) {
      pbVar7 = pbVar7 + 1;
      goto LAB_00127fcf;
    }
  }
  else {
    pbVar9 = pbVar1;
    if (lVar6 != 3) goto LAB_0012802d;
    iVar4 = isprint((uint)*pbVar7);
    pbVar9 = pbVar7;
    if (iVar4 != 0) {
      pbVar7 = pbVar7 + 1;
      goto LAB_00127fbf;
    }
  }
LAB_00127ff2:
  pbVar7 = pbVar9 + 1;
  if (pbVar7 != pbVar1 && pbVar9 != pbVar1) {
    do {
      bVar2 = *pbVar7;
      iVar4 = isprint((uint)bVar2);
      if (iVar4 != 0) {
        *pbVar9 = bVar2;
        pbVar9 = pbVar9 + 1;
      }
      pbVar7 = pbVar7 + 1;
    } while (pbVar7 != pbVar1);
    pbVar8 = (byte *)(xmlBlob->_M_dataplus)._M_p;
  }
LAB_0012802d:
  xmlBlob->_M_string_length = (long)pbVar9 - (long)pbVar8;
  *pbVar9 = 0;
  __s = (xmlBlob->_M_dataplus)._M_p;
  sVar5 = strlen(__s);
  xmlParseInNodeContext(parent_element,__s,sVar5 & 0xffffffff,0,&local_38);
  if (local_38 != 0) {
    xmlAddChild(parent_element);
  }
  return true;
}

Assistant:

bool exportXMLBlob(std::string xmlBlob, xmlNodePtr parent_element) {
     xmlNodePtr new_node = nullptr;
     // Let's remove non printable characters
     xmlBlob.erase(std::remove_if(xmlBlob.begin(), xmlBlob.end(),
         [](unsigned char c) {
             return !std::isprint(c);
         }),
         xmlBlob.end());
    // we assume that 'parent_element' node is already defined
    xmlParseInNodeContext(parent_element, xmlBlob.c_str(), strlen(xmlBlob.c_str()), 0, &new_node);
    if (new_node) xmlAddChild(parent_element, new_node);
    return true;
}